

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O3

int __thiscall EPoller::epoll(EPoller *this,int timeout,ChannelList *activeChannels)

{
  epoll_event *__events;
  int numEvents;
  Logger local_ff8;
  
  __events = (epoll_event *)
             (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
             super__Vector_impl_data._M_start;
  numEvents = epoll_wait(this->epollfd_,__events,
                         (int)((ulong)((long)(this->events_).
                                             super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)__events) >> 2) * -0x55555555,timeout);
  if (numEvents < 1) {
    if (numEvents < 0) {
      Logger::Logger(&local_ff8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                     ,0x1d);
      if (0x11 < ((int)&local_ff8 + 0xfa8) - (int)local_ff8.impl_.stream_.buffer_.cur_) {
        builtin_strncpy(local_ff8.impl_.stream_.buffer_.cur_,"Error: epoll_wait",0x11);
        local_ff8.impl_.stream_.buffer_.cur_ = local_ff8.impl_.stream_.buffer_.cur_ + 0x11;
      }
      Logger::~Logger(&local_ff8);
    }
  }
  else {
    fillActiveChannels(this,numEvents,activeChannels);
  }
  return numEvents;
}

Assistant:

int EPoller::epoll(int timeout, ChannelList* activeChannels) {

    int numEvents = epoll_wait(epollfd_, events_.data(), static_cast<int>(events_.size()), timeout);

    if (numEvents > 0) {
        // LOG << numEvents <<" events happended";

        fillActiveChannels(numEvents, activeChannels);
        
    } else if (numEvents < 0) {
        LOG << "Error: epoll_wait";
    }

    return numEvents;
}